

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

void exactinit(int verbose,int noexact,int nofilter,double maxx,double maxy,double maxz)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  int every_other;
  double lastcheck;
  double check;
  double half;
  double maxz_local;
  double maxy_local;
  double maxx_local;
  int nofilter_local;
  int noexact_local;
  int verbose_local;
  
  if (verbose != 0) {
    printf("  Initializing robust predicates.\n");
  }
  test_double(verbose);
  bVar2 = true;
  epsilon = 1.0;
  splitter = 1.0;
  lastcheck = 1.0;
  do {
    epsilon = epsilon * 0.5;
    if (bVar2) {
      splitter = splitter * 2.0;
    }
    bVar2 = (bool)(bVar2 ^ 1);
    dVar3 = epsilon + 1.0;
    bVar1 = false;
    if ((dVar3 != 1.0) || (NAN(dVar3))) {
      bVar1 = dVar3 != lastcheck;
    }
    lastcheck = dVar3;
  } while (bVar1);
  splitter = splitter + 1.0;
  resulterrbound = (epsilon * 8.0 + 3.0) * epsilon;
  ccwerrboundA = (epsilon * 16.0 + 3.0) * epsilon;
  ccwerrboundB = (epsilon * 12.0 + 2.0) * epsilon;
  ccwerrboundC = (epsilon * 64.0 + 9.0) * epsilon * epsilon;
  o3derrboundA = (epsilon * 56.0 + 7.0) * epsilon;
  o3derrboundB = (epsilon * 28.0 + 3.0) * epsilon;
  o3derrboundC = (epsilon * 288.0 + 26.0) * epsilon * epsilon;
  iccerrboundA = (epsilon * 96.0 + 10.0) * epsilon;
  iccerrboundB = (epsilon * 48.0 + 4.0) * epsilon;
  iccerrboundC = (epsilon * 576.0 + 44.0) * epsilon * epsilon;
  isperrboundA = (epsilon * 224.0 + 16.0) * epsilon;
  isperrboundB = (epsilon * 72.0 + 5.0) * epsilon;
  isperrboundC = (epsilon * 1408.0 + 71.0) * epsilon * epsilon;
  _use_inexact_arith = noexact;
  _use_static_filter = (uint)((nofilter != 0 ^ 0xffU) & 1);
  half = maxz;
  maxy_local = maxx;
  if (maxz < maxx) {
    half = maxx;
    maxy_local = maxz;
  }
  if (maxy <= half) {
    maxz_local = maxy;
    if (maxy < maxy_local) {
      maxz_local = maxy_local;
      maxy_local = maxy;
    }
  }
  else {
    maxz_local = half;
    half = maxy;
  }
  o3dstaticfilter = maxy_local * 5.11071278299733e-15 * maxz_local * half;
  ispstaticfilter = maxy_local * 1.2466136531027298e-13 * maxz_local * half * half * half;
  return;
}

Assistant:

void exactinit(int verbose, int noexact, int nofilter, REAL maxx, REAL maxy, 
               REAL maxz)
{
  REAL half;
  REAL check, lastcheck;
  int every_other;
#ifdef LINUX
  int cword;
#endif /* LINUX */

#ifdef CPU86
#ifdef SINGLE
  _control87(_PC_24, _MCW_PC); /* Set FPU control word for single precision. */
#else /* not SINGLE */
  _control87(_PC_53, _MCW_PC); /* Set FPU control word for double precision. */
#endif /* not SINGLE */
#endif /* CPU86 */
#ifdef LINUX
#ifdef SINGLE
  /*  cword = 4223; */
  cword = 4210;                 /* set FPU control word for single precision */
#else /* not SINGLE */
  /*  cword = 4735; */
  cword = 4722;                 /* set FPU control word for double precision */
#endif /* not SINGLE */
  _FPU_SETCW(cword);
#endif /* LINUX */

  if (verbose) {
    printf("  Initializing robust predicates.\n");
  }

#ifdef USE_CGAL_PREDICATES
  if (cgal_pred_obj.Has_static_filters) {
    printf("  Use static filter.\n");
  } else {
    printf("  No static filter.\n");
  }
#endif // USE_CGAL_PREDICATES

#ifdef SINGLE
  test_float(verbose);
#else
  test_double(verbose);
#endif

  every_other = 1;
  half = 0.5;
  epsilon = 1.0;
  splitter = 1.0;
  check = 1.0;
  /* Repeatedly divide `epsilon' by two until it is too small to add to    */
  /*   one without causing roundoff.  (Also check if the sum is equal to   */
  /*   the previous sum, for machines that round up instead of using exact */
  /*   rounding.  Not that this library will work on such machines anyway. */
  do {
    lastcheck = check;
    epsilon *= half;
    if (every_other) {
      splitter *= 2.0;
    }
    every_other = !every_other;
    check = 1.0 + epsilon;
  } while ((check != 1.0) && (check != lastcheck));
  splitter += 1.0;

  /* Error bounds for orientation and incircle tests. */
  resulterrbound = (3.0 + 8.0 * epsilon) * epsilon;
  ccwerrboundA = (3.0 + 16.0 * epsilon) * epsilon;
  ccwerrboundB = (2.0 + 12.0 * epsilon) * epsilon;
  ccwerrboundC = (9.0 + 64.0 * epsilon) * epsilon * epsilon;
  o3derrboundA = (7.0 + 56.0 * epsilon) * epsilon;
  o3derrboundB = (3.0 + 28.0 * epsilon) * epsilon;
  o3derrboundC = (26.0 + 288.0 * epsilon) * epsilon * epsilon;
  iccerrboundA = (10.0 + 96.0 * epsilon) * epsilon;
  iccerrboundB = (4.0 + 48.0 * epsilon) * epsilon;
  iccerrboundC = (44.0 + 576.0 * epsilon) * epsilon * epsilon;
  isperrboundA = (16.0 + 224.0 * epsilon) * epsilon;
  isperrboundB = (5.0 + 72.0 * epsilon) * epsilon;
  isperrboundC = (71.0 + 1408.0 * epsilon) * epsilon * epsilon;

  // Set TetGen options.  Added by H. Si, 2012-08-23.
  _use_inexact_arith = noexact;
  _use_static_filter = !nofilter;

  // Calculate the two static filters for orient3d() and insphere() tests.
  // Added by H. Si, 2012-08-23.

  // Sort maxx < maxy < maxz. Re-use 'half' for swapping.
  if (maxx > maxz) {
    half = maxx; maxx = maxz; maxz = half;
  }
  if (maxy > maxz) {
    half = maxy; maxy = maxz; maxz = half;
  }
  else if (maxy < maxx) {
    half = maxy; maxy = maxx; maxx = half;
  }

  o3dstaticfilter = 5.1107127829973299e-15 * maxx * maxy * maxz;
  ispstaticfilter = 1.2466136531027298e-13 * maxx * maxy * maxz * (maxz * maxz);

}